

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O3

void __thiscall Assimp::XFileExporter::WriteNode(XFileExporter *this,aiNode *pNode)

{
  ostream *poVar1;
  char *this_00;
  ulong uVar2;
  aiMatrix4x4 m;
  undefined1 *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [272];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"Node_",5);
    std::ostream::_M_insert<void_const*>((ostream *)(local_1b8 + 0x10));
    std::__cxx11::stringbuf::str();
    if (local_1d0 < 0x400) {
      (pNode->mName).length = (ai_uint32)local_1d0;
      memcpy((pNode->mName).data,local_1d8,local_1d0);
      (pNode->mName).data[local_1d0] = '\0';
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  this_00 = "Frame ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Frame ",6);
  toXFileString_abi_cxx11_((string *)local_1b8,(XFileExporter *)this_00,&pNode->mName);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_1b8._0_8_,local_1b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  std::__cxx11::string::append((char *)&this->startstr);
  local_1b8._0_8_ = *(undefined8 *)&pNode->mTransformation;
  local_1b8._8_4_ = (pNode->mTransformation).a3;
  local_1b8._12_4_ = (pNode->mTransformation).a4;
  local_1a8[0]._0_4_ = (pNode->mTransformation).b1;
  local_1a8[0]._4_4_ = (pNode->mTransformation).b2;
  local_1a8[0]._8_4_ = (pNode->mTransformation).b3;
  local_1a8[0]._12_4_ = (pNode->mTransformation).b4;
  local_1a8[1]._0_4_ = (pNode->mTransformation).c1;
  local_1a8[1]._4_4_ = (pNode->mTransformation).c2;
  local_1a8[1]._8_4_ = (pNode->mTransformation).c3;
  local_1a8[1]._12_4_ = (pNode->mTransformation).c4;
  local_1a8[2]._0_4_ = (pNode->mTransformation).d1;
  local_1a8[2]._4_4_ = (pNode->mTransformation).d2;
  local_1a8[2]._8_4_ = (pNode->mTransformation).d3;
  local_1a8[2]._12_4_ = (pNode->mTransformation).d4;
  WriteFrameTransform(this,(aiMatrix4x4 *)local_1b8);
  if (pNode->mNumMeshes != 0) {
    uVar2 = 0;
    do {
      WriteMesh(this,this->mScene->mMeshes[pNode->mMeshes[uVar2]]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar2 = 0;
    do {
      WriteNode(this,pNode->mChildren[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pNode->mNumChildren);
  }
  PopTag(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void XFileExporter::WriteNode( aiNode* pNode)
{
    if (pNode->mName.length==0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }
    mOutput << startstr << "Frame " << toXFileString(pNode->mName) << " {" << endstr;

    PushTag();

    aiMatrix4x4 m = pNode->mTransformation;

    WriteFrameTransform(m);

    for (size_t i = 0; i < pNode->mNumMeshes; ++i)
        WriteMesh(mScene->mMeshes[pNode->mMeshes[i]]);

    // recursive call the Nodes
    for (size_t i = 0; i < pNode->mNumChildren; ++i)
        WriteNode(pNode->mChildren[i]);

    PopTag();

    mOutput << startstr << "}" << endstr << endstr;
}